

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall TestSchema::createExampleSchema(TestSchema *this)

{
  ValidSchema validComplexArray;
  ArraySchema complexArray;
  RecordSchema myRecord;
  DoubleSchema *in_stack_ffffffffffffff00;
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator<char> local_b9;
  Schema local_b8 [63];
  allocator<char> local_79;
  Schema local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  RecordSchema local_20 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  avro::RecordSchema::RecordSchema(local_20,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  avro::DoubleSchema::DoubleSchema(in_stack_ffffffffffffff00);
  avro::RecordSchema::addField((string *)local_20,local_78);
  avro::DoubleSchema::~DoubleSchema((DoubleSchema *)0x29ba55);
  std::__cxx11::string::~string((string *)local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  avro::DoubleSchema::DoubleSchema(in_stack_ffffffffffffff00);
  avro::RecordSchema::addField((string *)local_20,local_b8);
  avro::DoubleSchema::~DoubleSchema((DoubleSchema *)0x29bac3);
  std::__cxx11::string::~string((string *)local_b8);
  std::allocator<char>::~allocator(&local_b9);
  avro::ArraySchema::ArraySchema((ArraySchema *)&stack0xffffffffffffff10,(Schema *)local_20);
  avro::ValidSchema::ValidSchema
            ((ValidSchema *)&stack0xffffffffffffff00,(Schema *)&stack0xffffffffffffff10);
  avro::ValidSchema::toJson((ostream *)&stack0xffffffffffffff00);
  avro::ValidSchema::~ValidSchema((ValidSchema *)0x29bb19);
  avro::ArraySchema::~ArraySchema((ArraySchema *)0x29bb23);
  avro::RecordSchema::~RecordSchema((RecordSchema *)0x29bb30);
  return;
}

Assistant:

void createExampleSchema()
    {
        // First construct our complex data type:
        avro::RecordSchema myRecord("complex");
   
        // Now populate my record with fields (each field is another schema):
        myRecord.addField("real", avro::DoubleSchema());
        myRecord.addField("imaginary", avro::DoubleSchema());

        // The complex record is the same as used above, let's make a schema 
        // for an array of these record
  
        avro::ArraySchema complexArray(myRecord); 

        avro::ValidSchema validComplexArray(complexArray);
        validComplexArray.toJson(std::cout);
    }